

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O3

bool axl::io::isSockAddrMatch_ip6(sockaddr_in6 *addr,sockaddr_in6 *filterAddr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  in6_addr addrAny;
  
  if ((filterAddr->sin6_port != 0) && (addr->sin6_port != filterAddr->sin6_port)) {
    return false;
  }
  auVar1[0] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[0] == '\0');
  auVar1[1] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[1] == '\0');
  auVar1[2] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[2] == '\0');
  auVar1[3] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[3] == '\0');
  auVar1[4] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[4] == '\0');
  auVar1[5] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[5] == '\0');
  auVar1[6] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[6] == '\0');
  auVar1[7] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[7] == '\0');
  auVar1[8] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[8] == '\0');
  auVar1[9] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[9] == '\0');
  auVar1[10] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[10] == '\0');
  auVar1[0xb] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[0xb] == '\0');
  auVar1[0xc] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[0xc] == '\0');
  auVar1[0xd] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[0xd] == '\0');
  auVar1[0xe] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[0xe] == '\0');
  auVar1[0xf] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[0xf] == '\0');
  if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf) !=
      0xffff) {
    auVar2[0] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[0] ==
                 (addr->sin6_addr).__in6_u.__u6_addr8[0]);
    auVar2[1] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[1] ==
                 (addr->sin6_addr).__in6_u.__u6_addr8[1]);
    auVar2[2] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[2] ==
                 (addr->sin6_addr).__in6_u.__u6_addr8[2]);
    auVar2[3] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[3] ==
                 (addr->sin6_addr).__in6_u.__u6_addr8[3]);
    auVar2[4] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[4] ==
                 (addr->sin6_addr).__in6_u.__u6_addr8[4]);
    auVar2[5] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[5] ==
                 (addr->sin6_addr).__in6_u.__u6_addr8[5]);
    auVar2[6] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[6] ==
                 (addr->sin6_addr).__in6_u.__u6_addr8[6]);
    auVar2[7] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[7] ==
                 (addr->sin6_addr).__in6_u.__u6_addr8[7]);
    auVar2[8] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[8] ==
                 (addr->sin6_addr).__in6_u.__u6_addr8[8]);
    auVar2[9] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[9] ==
                 (addr->sin6_addr).__in6_u.__u6_addr8[9]);
    auVar2[10] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[10] ==
                  (addr->sin6_addr).__in6_u.__u6_addr8[10]);
    auVar2[0xb] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[0xb] ==
                   (addr->sin6_addr).__in6_u.__u6_addr8[0xb]);
    auVar2[0xc] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[0xc] ==
                   (addr->sin6_addr).__in6_u.__u6_addr8[0xc]);
    auVar2[0xd] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[0xd] ==
                   (addr->sin6_addr).__in6_u.__u6_addr8[0xd]);
    auVar2[0xe] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[0xe] ==
                   (addr->sin6_addr).__in6_u.__u6_addr8[0xe]);
    auVar2[0xf] = -((filterAddr->sin6_addr).__in6_u.__u6_addr8[0xf] ==
                   (addr->sin6_addr).__in6_u.__u6_addr8[0xf]);
    return (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar2[0xf] >> 7) << 0xf) == 0xffff;
  }
  return true;
}

Assistant:

bool
isSockAddrMatch_ip6(
	const sockaddr_in6* addr,
	const sockaddr_in6* filterAddr
) {
	in6_addr addrAny = { 0 };

	return
		(!filterAddr->sin6_port || addr->sin6_port == filterAddr->sin6_port) &&
		(memcmp(&filterAddr->sin6_addr, &addrAny, sizeof(addrAny)) == 0 ||
		memcmp(&addr->sin6_addr, &filterAddr->sin6_addr, sizeof(addr->sin6_addr)) == 0);
}